

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.h
# Opt level: O2

bool Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals
               (JavascriptString *str1,PropertyRecord *str2)

{
  bool bVar1;
  charcount_t cVar2;
  char16 *s1;
  
  cVar2 = JavascriptString::GetLength(str1);
  if ((cVar2 == str2->byteCount >> 1) && (0xf < (uint)str2->pid)) {
    s1 = JavascriptString::GetString(str1);
    cVar2 = JavascriptString::GetLength(str1);
    bVar1 = JsUtil::CharacterBuffer<char16_t>::StaticEquals(s1,(WCHAR *)(str2 + 1),cVar2);
    return bVar1;
  }
  return false;
}

Assistant:

inline static bool Equals(JavascriptString * str1, PropertyRecord const * str2)
        {
            return (str1->GetLength() == str2->GetLength() && !Js::IsInternalPropertyId(str2->GetPropertyId()) &&
                JsUtil::CharacterBuffer<WCHAR>::StaticEquals(str1->GetString(), str2->GetBuffer(), str1->GetLength()));
        }